

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTree.cpp
# Opt level: O0

void __thiscall ASTree::expandDot(ASTree *this,Graph *graph)

{
  undefined8 uVar1;
  bool bVar2;
  reference ppAVar3;
  allocator<char> local_1b1;
  string local_1b0;
  Connection local_190;
  undefined1 local_130 [8];
  string nameSub;
  ASTree *subtree;
  iterator __end1;
  iterator __begin1;
  vector<ASTree_*,_std::allocator<ASTree_*>_> *__range1;
  allocator<char> local_d9;
  string local_d8;
  Node local_b8;
  undefined1 local_38 [8];
  string name;
  Graph *graph_local;
  ASTree *this_local;
  
  name.field_2._8_8_ = graph;
  dotName_abi_cxx11_((string *)local_38,this,this);
  uVar1 = name.field_2._8_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,"circle",&local_d9);
  Node::Node(&local_b8,(string *)local_38,&this->root,&local_d8);
  Graph::addNode((Graph *)uVar1,&local_b8);
  Node::~Node(&local_b8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::allocator<char>::~allocator(&local_d9);
  __end1 = std::vector<ASTree_*,_std::allocator<ASTree_*>_>::begin(&this->subtrees);
  subtree = (ASTree *)std::vector<ASTree_*,_std::allocator<ASTree_*>_>::end(&this->subtrees);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<ASTree_**,_std::vector<ASTree_*,_std::allocator<ASTree_*>_>_>
                                *)&subtree);
    if (!bVar2) break;
    ppAVar3 = __gnu_cxx::
              __normal_iterator<ASTree_**,_std::vector<ASTree_*,_std::allocator<ASTree_*>_>_>::
              operator*(&__end1);
    nameSub.field_2._8_8_ = *ppAVar3;
    dotName_abi_cxx11_((string *)local_130,this,(ASTree *)nameSub.field_2._8_8_);
    uVar1 = name.field_2._8_8_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b0,"",&local_1b1);
    Connection::Connection(&local_190,(string *)local_38,(string *)local_130,&local_1b0);
    Graph::addConnection((Graph *)uVar1,&local_190);
    Connection::~Connection(&local_190);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::allocator<char>::~allocator(&local_1b1);
    expandDot((ASTree *)nameSub.field_2._8_8_,(Graph *)name.field_2._8_8_);
    std::__cxx11::string::~string((string *)local_130);
    __gnu_cxx::__normal_iterator<ASTree_**,_std::vector<ASTree_*,_std::allocator<ASTree_*>_>_>::
    operator++(&__end1);
  }
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void ASTree::expandDot(Graph &graph) {


    std::string name = dotName(this);

    graph.addNode(Node(name, root, "circle"));

    for (auto subtree: subtrees) {

        std::string nameSub = dotName(subtree);

        graph.addConnection(Connection(name, nameSub, ""));

        subtree->expandDot(graph);
    }
}